

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcAlarmType::~IfcAlarmType(IfcAlarmType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcDistributionControlElementType).
                              super_IfcDistributionElementType.super_IfcElementType.
                              super_IfcTypeProduct.super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeProduct *)
            (&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &this->field_0x1c0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1c0) = 0x93f650;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x93f790;
  *(undefined8 *)((long)pvVar1 + -0x138) = 0x93f678;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x93f6a0;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x93f6c8;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x93f6f0;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x93f718;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x93f740;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x93f768;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x93fbf0;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x70 = 0x93fcb8;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x93fc18;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x93fc40;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x93fc68;
  *(undefined8 *)&this_00->field_0x148 = 0x93fc90;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__0093f7c0);
  return;
}

Assistant:

IfcAlarmType() : Object("IfcAlarmType") {}